

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  int iVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *in_RSI;
  long in_RDI;
  ImGuiWindow *focus_window;
  ImGuiWindow *window;
  int i;
  int under_this_window_idx;
  int start_idx;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffc8;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  iVar1 = (GImGui->WindowsFocusOrder).Size + -1;
  if ((in_RDI != 0) &&
     (iVar2 = FindWindowFocusIndex
                        ((ImGuiWindow *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)), iVar2 != -1
     )) {
    iVar1 = iVar2 + -1;
  }
  while( true ) {
    if (iVar1 < 0) {
      FocusWindow(in_RSI);
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)in_stack_ffffffffffffffd0,
                         (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    in_stack_ffffffffffffffd0 = *ppIVar3;
    if ((((in_stack_ffffffffffffffd0 != in_RSI) &&
         ((in_stack_ffffffffffffffd0->WasActive & 1U) != 0)) &&
        ((in_stack_ffffffffffffffd0->Flags & 0x1000000U) == 0)) &&
       ((in_stack_ffffffffffffffd0->Flags & 0x40200U) != 0x40200)) break;
    iVar1 = iVar1 + -1;
  }
  NavRestoreLastChildNavWindow(in_stack_ffffffffffffffd0);
  FocusWindow(in_RSI);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}